

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePrimMetas(AsciiParser *this,PrimMetaMap *args)

{
  bool bVar1;
  bool bVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  mapped_type *this_00;
  ostream *poVar5;
  char *pcVar6;
  char s;
  string local_210;
  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> m;
  ostringstream ss_e;
  
  bVar1 = Expect(this,'(');
  if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
    while( true ) {
      bVar1 = Eof(this);
      if (bVar1) {
        return bVar1;
      }
      bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return bVar1;
      }
      bVar1 = Char1(this,&s);
      if (!bVar1) {
        return false;
      }
      if (s == ')') {
        return true;
      }
      Rewind(this,1);
      ParsePrimMeta((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)&ss_e,
                    this);
      nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
      optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                (&m,(optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)&ss_e);
      nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
      ~optional((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)&ss_e);
      if (m.has_value_ != true) break;
      pvVar3 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::value(&m);
      if ((pvVar3->second)._name._M_string_length == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ParsePrimMetas");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xc85);
        ::std::operator<<(poVar5," ");
        pcVar6 = "[InternalError] Metadataum name is empty.";
        goto LAB_00297102;
      }
      pvVar3 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::value(&m);
      pvVar4 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::value(&m);
      this_00 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                ::operator[](args,(key_type *)&(pvVar4->second)._name);
      ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::operator=(this_00,pvVar3);
      nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
      ~optional(&m);
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ParsePrimMetas");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xc8a);
    ::std::operator<<(poVar5," ");
    pcVar6 = "Failed to parse Meta value.";
LAB_00297102:
    poVar5 = ::std::operator<<((ostream *)&ss_e,pcVar6);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_210);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::
    ~optional(&m);
  }
  return false;
}

Assistant:

bool AsciiParser::ParsePrimMetas(PrimMetaMap *args) {
  // '(' args ')'
  // args = list of argument, separated by newline.

  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    // std::cout << "skip comment/whitespace/nl failed\n";
    DCOUT("SkipCommentAndWhitespaceAndNewline failed.");
    return false;
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      // std::cout << "2: skip comment/whitespace/nl failed\n";
      return false;
    }

    char s;
    if (!Char1(&s)) {
      return false;
    }

    if (s == ')') {
      DCOUT("Prim meta end");
      // End
      break;
    }

    Rewind(1);

    DCOUT("Start PrimMeta parse.");

    // ty = std::pair<ListEditQual, MetaVariable>;
    if (auto m = ParsePrimMeta()) {
      DCOUT("PrimMeta: list-edit qual = "
            << tinyusdz::to_string(std::get<0>(m.value()))
            << ", name = " << std::get<1>(m.value()).get_name());

      if (std::get<1>(m.value()).get_name().empty()) {
        PUSH_ERROR_AND_RETURN("[InternalError] Metadataum name is empty.");
      }

      (*args)[std::get<1>(m.value()).get_name()] = m.value();
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse Meta value.");
    }
  }

  return true;
}